

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O1

bool embree::sse2::InstanceIntersector1::pointQuery
               (PointQuery *query,PointQueryContext *context,InstancePrimitive *prim)

{
  float (*pafVar1) [16];
  float *pfVar2;
  Instance *pIVar3;
  AffineSpace3ff *pAVar4;
  RTCPointQueryContext *pRVar5;
  long lVar6;
  undefined1 uVar7;
  uint uVar8;
  bool bVar9;
  float fVar10;
  float __x;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined8 local_128;
  float local_120;
  float local_11c;
  float local_118;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 local_90;
  PointQuery *local_88;
  int local_80;
  PointQueryFunction local_78;
  RTCPointQueryContext *local_70;
  float local_68;
  void *local_60;
  undefined8 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  pIVar3 = prim->instance;
  pAVar4 = pIVar3->local2world;
  if ((pIVar3->super_Geometry).field_8.field_0x1 == '\x01') {
    fVar10 = (pAVar4->p).field_0.m128[3];
    fVar29 = (pAVar4->l).vx.field_0.m128[3];
    fVar35 = (pAVar4->l).vy.field_0.m128[3];
    fVar36 = (pAVar4->l).vz.field_0.m128[3];
    fVar41 = (pAVar4->l).vx.field_0.m128[0];
    fVar42 = (pAVar4->l).vy.field_0.m128[0];
    fVar38 = (pAVar4->l).vy.field_0.m128[1];
    fVar37 = fVar29 * fVar35 + fVar10 * fVar36;
    fVar12 = fVar29 * fVar35 - fVar10 * fVar36;
    fVar17 = fVar10 * fVar10 + fVar29 * fVar29 + -fVar35 * fVar35 + -fVar36 * fVar36;
    fVar33 = fVar10 * fVar10 - fVar29 * fVar29;
    fVar34 = fVar35 * fVar35 + fVar33 + -fVar36 * fVar36;
    fVar43 = fVar29 * fVar36 - fVar10 * fVar35;
    fVar22 = fVar10 * fVar35 + fVar29 * fVar36;
    fVar39 = fVar35 * fVar36 + fVar10 * fVar29;
    fVar10 = fVar35 * fVar36 - fVar10 * fVar29;
    fVar37 = fVar37 + fVar37;
    fVar43 = fVar43 + fVar43;
    fVar29 = fVar36 * fVar36 + fVar33 + -fVar35 * fVar35;
    fVar18 = fVar17 * 1.0 + fVar37 * 0.0 + fVar43 * 0.0;
    fVar19 = fVar17 * 0.0 + fVar37 * 1.0 + fVar43 * 0.0;
    fVar20 = fVar17 * 0.0 + fVar37 * 0.0 + fVar43 * 1.0;
    fVar21 = fVar17 * 0.0 + fVar37 * 0.0 + fVar43 * 0.0;
    fVar39 = fVar39 + fVar39;
    fVar12 = fVar12 + fVar12;
    fVar43 = fVar12 * 1.0 + fVar34 * 0.0 + fVar39 * 0.0;
    fVar13 = fVar12 * 0.0 + fVar34 * 1.0 + fVar39 * 0.0;
    fVar14 = fVar12 * 0.0 + fVar34 * 0.0 + fVar39 * 1.0;
    fVar15 = fVar12 * 0.0 + fVar34 * 0.0 + fVar39 * 0.0;
    fVar34 = (pAVar4->l).vz.field_0.m128[0];
    fVar37 = (pAVar4->l).vz.field_0.m128[1];
    fVar39 = (pAVar4->l).vz.field_0.m128[2];
    fVar40 = (pAVar4->p).field_0.m128[0];
    fVar27 = (pAVar4->p).field_0.m128[1];
    fVar28 = (pAVar4->p).field_0.m128[2];
    fVar22 = fVar22 + fVar22;
    fVar10 = fVar10 + fVar10;
    fVar23 = fVar22 * 1.0 + fVar10 * 0.0 + fVar29 * 0.0;
    fVar24 = fVar22 * 0.0 + fVar10 * 1.0 + fVar29 * 0.0;
    fVar25 = fVar22 * 0.0 + fVar10 * 0.0 + fVar29 * 1.0;
    fVar26 = fVar22 * 0.0 + fVar10 * 0.0 + fVar29 * 0.0;
    fVar10 = fVar41 * fVar18 + fVar43 * 0.0 + fVar23 * 0.0;
    fVar29 = fVar41 * fVar19 + fVar13 * 0.0 + fVar24 * 0.0;
    fVar35 = fVar41 * fVar20 + fVar14 * 0.0 + fVar25 * 0.0;
    fVar36 = fVar41 * fVar21 + fVar15 * 0.0 + fVar26 * 0.0;
    fVar41 = fVar42 * fVar18 + fVar38 * fVar43 + fVar23 * 0.0;
    fVar12 = fVar42 * fVar19 + fVar38 * fVar13 + fVar24 * 0.0;
    fVar17 = fVar42 * fVar20 + fVar38 * fVar14 + fVar25 * 0.0;
    fVar42 = fVar42 * fVar21 + fVar38 * fVar15 + fVar26 * 0.0;
    fVar38 = fVar34 * fVar18 + fVar37 * fVar43 + fVar39 * fVar23;
    fVar22 = fVar34 * fVar19 + fVar37 * fVar13 + fVar39 * fVar24;
    fVar33 = fVar34 * fVar20 + fVar37 * fVar14 + fVar39 * fVar25;
    fVar34 = fVar34 * fVar21 + fVar37 * fVar15 + fVar39 * fVar26;
    fVar37 = fVar40 * fVar18 + fVar27 * fVar43 + fVar28 * fVar23 +
             (pAVar4->l).vx.field_0.m128[1] + 0.0;
    fVar39 = fVar40 * fVar19 + fVar27 * fVar13 + fVar28 * fVar24 +
             (pAVar4->l).vx.field_0.m128[2] + 0.0;
    fVar43 = fVar40 * fVar20 + fVar27 * fVar14 + fVar28 * fVar25 +
             (pAVar4->l).vy.field_0.m128[2] + 0.0;
    fVar40 = fVar40 * fVar21 + fVar27 * fVar15 + fVar28 * fVar26 + 0.0;
  }
  else {
    fVar10 = (pAVar4->l).vx.field_0.m128[0];
    fVar29 = (pAVar4->l).vx.field_0.m128[1];
    fVar35 = (pAVar4->l).vx.field_0.m128[2];
    fVar36 = (pAVar4->l).vx.field_0.m128[3];
    fVar41 = (pAVar4->l).vy.field_0.m128[0];
    fVar12 = (pAVar4->l).vy.field_0.m128[1];
    fVar17 = (pAVar4->l).vy.field_0.m128[2];
    fVar42 = (pAVar4->l).vy.field_0.m128[3];
    fVar38 = (pAVar4->l).vz.field_0.m128[0];
    fVar22 = (pAVar4->l).vz.field_0.m128[1];
    fVar33 = (pAVar4->l).vz.field_0.m128[2];
    fVar34 = (pAVar4->l).vz.field_0.m128[3];
    fVar37 = (pAVar4->p).field_0.m128[0];
    fVar39 = (pAVar4->p).field_0.m128[1];
    fVar43 = (pAVar4->p).field_0.m128[2];
    fVar40 = (pAVar4->p).field_0.m128[3];
  }
  fVar27 = (pIVar3->world2local0).l.vx.field_0.m128[0];
  fVar28 = (pIVar3->world2local0).l.vx.field_0.m128[1];
  fVar13 = (pIVar3->world2local0).l.vx.field_0.m128[2];
  fVar14 = (pIVar3->world2local0).l.vx.field_0.m128[3];
  fVar15 = (pIVar3->world2local0).l.vy.field_0.m128[0];
  fVar18 = (pIVar3->world2local0).l.vy.field_0.m128[1];
  fVar19 = (pIVar3->world2local0).l.vy.field_0.m128[2];
  fVar20 = (pIVar3->world2local0).l.vy.field_0.m128[3];
  fVar21 = (pIVar3->world2local0).l.vz.field_0.m128[0];
  fVar23 = (pIVar3->world2local0).l.vz.field_0.m128[1];
  fVar24 = (pIVar3->world2local0).l.vz.field_0.m128[2];
  fVar25 = (pIVar3->world2local0).l.vz.field_0.m128[3];
  fVar26 = (pIVar3->world2local0).p.field_0.m128[0];
  fVar30 = (pIVar3->world2local0).p.field_0.m128[1];
  fVar31 = (pIVar3->world2local0).p.field_0.m128[2];
  fVar32 = (pIVar3->world2local0).p.field_0.m128[3];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_68 = 0.0;
    if (((1e-05 < ABS(fVar13 * fVar19 + fVar28 * fVar18 + fVar27 * fVar15)) ||
        (1e-05 < ABS(fVar13 * fVar24 + fVar28 * fVar23 + fVar27 * fVar21))) ||
       (1e-05 < ABS(fVar19 * fVar24 + fVar18 * fVar23 + fVar15 * fVar21))) {
      bVar9 = false;
    }
    else {
      __x = fVar13 * fVar13 + fVar28 * fVar28 + fVar27 * fVar27;
      fVar11 = fVar18 * fVar18 + fVar15 * fVar15 + fVar19 * fVar19;
      bVar9 = false;
      if (((ABS(__x - fVar11) <= 1e-05) &&
          (fVar16 = fVar23 * fVar23 + fVar21 * fVar21 + fVar24 * fVar24, bVar9 = false,
          ABS(__x - fVar16) <= 1e-05)) &&
         (fVar11 = ABS(fVar11 - fVar16), bVar9 = fVar11 <= 1e-05, fVar11 <= 1e-05)) {
        bVar9 = true;
        if (__x < 0.0) {
          local_108 = fVar21;
          fStack_104 = fVar23;
          fStack_100 = fVar24;
          fStack_fc = fVar25;
          local_f8 = fVar26;
          fStack_f4 = fVar30;
          fStack_f0 = fVar31;
          fStack_ec = fVar32;
          local_e8 = fVar15;
          fStack_e4 = fVar18;
          fStack_e0 = fVar19;
          fStack_dc = fVar20;
          local_d8 = fVar27;
          fStack_d4 = fVar28;
          fStack_d0 = fVar13;
          fStack_cc = fVar14;
          local_c8 = fVar41;
          fStack_c4 = fVar12;
          fStack_c0 = fVar17;
          fStack_bc = fVar42;
          local_b8 = fVar37;
          fStack_b4 = fVar39;
          fStack_b0 = fVar43;
          fStack_ac = fVar40;
          local_a8 = fVar38;
          fStack_a4 = fVar22;
          fStack_a0 = fVar33;
          fStack_9c = fVar34;
          local_68 = sqrtf(__x);
          fVar27 = local_d8;
          fVar28 = fStack_d4;
          fVar13 = fStack_d0;
          fVar14 = fStack_cc;
          fVar15 = local_e8;
          fVar18 = fStack_e4;
          fVar19 = fStack_e0;
          fVar20 = fStack_dc;
          fVar26 = local_f8;
          fVar30 = fStack_f4;
          fVar31 = fStack_f0;
          fVar32 = fStack_ec;
          fVar21 = local_108;
          fVar23 = fStack_104;
          fVar24 = fStack_100;
          fVar25 = fStack_fc;
          fVar38 = local_a8;
          fVar22 = fStack_a4;
          fVar33 = fStack_a0;
          fVar34 = fStack_9c;
          fVar37 = local_b8;
          fVar39 = fStack_b4;
          fVar43 = fStack_b0;
          fVar40 = fStack_ac;
          fVar41 = local_c8;
          fVar12 = fStack_c4;
          fVar17 = fStack_c0;
          fVar42 = fStack_bc;
        }
        else {
          local_68 = SQRT(__x);
        }
      }
    }
    local_80 = 2 - (uint)bVar9;
  }
  else {
    local_80 = 2;
    local_68 = 0.0;
  }
  pRVar5 = context->userContext;
  uVar8 = pRVar5->instStackSize;
  pRVar5->instID[uVar8] = prim->instID_;
  pRVar5->instPrimID[uVar8] = 0;
  pafVar1 = pRVar5->world2inst + uVar8;
  (*pafVar1)[0] = fVar27;
  (*pafVar1)[1] = fVar28;
  (*pafVar1)[2] = fVar13;
  (*pafVar1)[3] = fVar14;
  pfVar2 = pRVar5->world2inst[uVar8] + 4;
  *pfVar2 = fVar15;
  pfVar2[1] = fVar18;
  pfVar2[2] = fVar19;
  pfVar2[3] = fVar20;
  pfVar2 = pRVar5->world2inst[uVar8] + 8;
  *pfVar2 = fVar21;
  pfVar2[1] = fVar23;
  pfVar2[2] = fVar24;
  pfVar2[3] = fVar25;
  pfVar2 = pRVar5->world2inst[uVar8] + 0xc;
  *pfVar2 = fVar26;
  pfVar2[1] = fVar30;
  pfVar2[2] = fVar31;
  pfVar2[3] = fVar32;
  pafVar1 = pRVar5->inst2world + uVar8;
  (*pafVar1)[0] = fVar10;
  (*pafVar1)[1] = fVar29;
  (*pafVar1)[2] = fVar35;
  (*pafVar1)[3] = fVar36;
  pfVar2 = pRVar5->inst2world[uVar8] + 4;
  *pfVar2 = fVar41;
  pfVar2[1] = fVar12;
  pfVar2[2] = fVar17;
  pfVar2[3] = fVar42;
  pfVar2 = pRVar5->inst2world[uVar8] + 8;
  *pfVar2 = fVar38;
  pfVar2[1] = fVar22;
  pfVar2[2] = fVar33;
  pfVar2[3] = fVar34;
  pfVar2 = pRVar5->inst2world[uVar8] + 0xc;
  *pfVar2 = fVar37;
  pfVar2[1] = fVar39;
  pfVar2[2] = fVar43;
  pfVar2[3] = fVar40;
  pRVar5->instStackSize = pRVar5->instStackSize + 1;
  local_11c = query->time;
  fVar10 = (query->p).field_0.field_0.x;
  fVar29 = (query->p).field_0.field_0.y;
  fVar35 = (query->p).field_0.field_0.z;
  local_120 = fVar10 * fVar13 + fVar29 * fVar19 + fVar35 * fVar24 + fVar31;
  local_128 = CONCAT44(fVar10 * fVar28 + fVar29 * fVar18 + fVar35 * fVar23 + fVar30,
                       fVar10 * fVar27 + fVar29 * fVar15 + fVar35 * fVar21 + fVar26);
  local_118 = query->radius * local_68;
  local_98 = *(undefined8 *)&(pIVar3->super_Geometry).field_0x58;
  local_88 = context->query_ws;
  local_78 = context->func;
  local_70 = context->userContext;
  local_60 = context->userPtr;
  local_90 = 0;
  local_58 = 0xffffffffffffffff;
  local_48 = local_88->radius;
  fVar10 = local_88->radius;
  if (local_80 == 2) {
    fStack_44 = fVar10;
    fStack_40 = fVar10;
    fStack_3c = fVar10;
    if ((fVar10 < INFINITY) && (local_70->instStackSize != 0)) {
      fStack_44 = local_48;
      fStack_40 = local_48;
      fStack_3c = local_48;
      pointQuery();
      fVar10 = local_38;
      fStack_44 = fStack_34;
      fStack_40 = fStack_30;
      fStack_3c = fStack_2c;
    }
  }
  else {
    fVar10 = local_68 * fVar10;
    fStack_44 = fVar10;
    fStack_40 = fVar10;
    fStack_3c = fVar10;
  }
  lVar6 = *(long *)&(pIVar3->super_Geometry).field_0x58;
  local_48 = fVar10;
  uVar7 = (**(code **)(lVar6 + 0x88))(lVar6 + 0x58,&local_128);
  pRVar5 = context->userContext;
  uVar8 = pRVar5->instStackSize - 1;
  pRVar5->instStackSize = uVar8;
  pRVar5->instID[uVar8] = 0xffffffff;
  pRVar5->instPrimID[pRVar5->instStackSize] = 0xffffffff;
  return (bool)uVar7;
}

Assistant:

bool InstanceIntersector1::pointQuery(PointQuery* query, PointQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;

      const AffineSpace3fa local2world = instance->getLocal2World();
      const AffineSpace3fa world2local = instance->getWorld2Local();
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);
      assert((similtude && similarityScale > 0) || !similtude);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, 0, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)instance->object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func,
          context->userContext,
          similarityScale,
          context->userPtr);

        bool changed = instance->object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }